

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O3

XSAttributeUse * __thiscall
xercesc_4_0::XSObjectFactory::createXSAttributeUse
          (XSObjectFactory *this,XSAttributeDeclaration *xsAttDecl,XSModel *xsModel)

{
  BaseRefVectorOf<xercesc_4_0::XSObject> *this_00;
  XMLSize_t XVar1;
  XSAttributeUse *this_01;
  
  this_01 = (XSAttributeUse *)XMemory::operator_new(0x40,this->fMemoryManager);
  XSAttributeUse::XSAttributeUse(this_01,xsAttDecl,xsModel,this->fMemoryManager);
  this_00 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
  BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(this_00,1);
  XVar1 = this_00->fCurCount;
  this_00->fElemList[XVar1] = (XSObject *)this_01;
  this_00->fCurCount = XVar1 + 1;
  return this_01;
}

Assistant:

XSAttributeUse*
XSObjectFactory::createXSAttributeUse(XSAttributeDeclaration* const xsAttDecl,
                               XSModel* const xsModel)
{
    XSAttributeUse* attrUse = new (fMemoryManager) XSAttributeUse(xsAttDecl, xsModel, fMemoryManager);
    fDeleteVector->addElement(attrUse);

    return attrUse;
}